

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::Convolution3DLayerParams::ByteSizeLong(Convolution3DLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  size_t sVar9;
  
  uVar3 = (this->outputshape_).current_size_;
  uVar6 = 0;
  if ((int)uVar3 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,(int)uVar6);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      uVar8 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar8;
    } while (uVar3 != uVar8);
    if (lVar7 == 0) {
      lVar7 = 0;
      uVar6 = 0;
    }
    else if ((int)(uint)lVar7 < 0) {
      uVar6 = 0xc;
    }
    else {
      uVar3 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
  }
  this->_outputshape_cached_byte_size_ = (int)lVar7;
  sVar9 = uVar6 + lVar7;
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->weights_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar9 = sVar9 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->bias_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar9 = sVar9 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  uVar3 = this->outputchannels_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->inputchannels_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->ngroups_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->kerneldepth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->kernelheight_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->kernelwidth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->stridedepth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->strideheight_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->stridewidth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->dilationdepth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->dilationheight_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->dilationwidth_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  sVar5 = sVar9 + 3;
  if (this->hasbias_ == false) {
    sVar5 = sVar9;
  }
  sVar9 = sVar5 + 3;
  if (this->isdeconvolution_ == false) {
    sVar9 = sVar5;
  }
  uVar3 = this->paddingtype_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingfront_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingback_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingtop_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingbottom_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingleft_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  uVar3 = this->custompaddingright_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar6;
  }
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t Convolution3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Convolution3DLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 87;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 60;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 61;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // int32 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->outputchannels());
  }

  // int32 inputChannels = 2;
  if (this->inputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->inputchannels());
  }

  // int32 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->ngroups());
  }

  // int32 kernelDepth = 20;
  if (this->kerneldepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kerneldepth());
  }

  // int32 kernelHeight = 21;
  if (this->kernelheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelheight());
  }

  // int32 kernelWidth = 22;
  if (this->kernelwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelwidth());
  }

  // int32 strideDepth = 31;
  if (this->stridedepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridedepth());
  }

  // int32 strideHeight = 32;
  if (this->strideheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->strideheight());
  }

  // int32 strideWidth = 33;
  if (this->stridewidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridewidth());
  }

  // int32 dilationDepth = 40;
  if (this->dilationdepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationdepth());
  }

  // int32 dilationHeight = 41;
  if (this->dilationheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationheight());
  }

  // int32 dilationWidth = 42;
  if (this->dilationwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationwidth());
  }

  // bool hasBias = 50;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  // bool isDeconvolution = 86;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
  if (this->paddingtype() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->paddingtype());
  }

  // int32 customPaddingFront = 80;
  if (this->custompaddingfront() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingfront());
  }

  // int32 customPaddingBack = 81;
  if (this->custompaddingback() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingback());
  }

  // int32 customPaddingTop = 82;
  if (this->custompaddingtop() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingtop());
  }

  // int32 customPaddingBottom = 83;
  if (this->custompaddingbottom() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingbottom());
  }

  // int32 customPaddingLeft = 84;
  if (this->custompaddingleft() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingleft());
  }

  // int32 customPaddingRight = 85;
  if (this->custompaddingright() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingright());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}